

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

roaring64_bitmap_t * roaring64_bitmap_of(size_t n_args,...)

{
  uint uVar1;
  roaring64_bitmap_t *in_RSI;
  ulong in_RDI;
  uint64_t val;
  size_t i;
  va_list ap;
  roaring64_bulk_context_t context;
  roaring64_bitmap_t *r;
  undefined4 in_stack_ffffffffffffff00;
  roaring64_bulk_context_t *in_stack_ffffffffffffff08;
  ulong local_40;
  uint local_38;
  undefined1 local_20 [16];
  roaring64_bitmap_t *local_10;
  ulong local_8;
  
  local_8 = in_RDI;
  local_10 = roaring64_bitmap_create();
  memset(local_20,0,0x10);
  local_38 = 8;
  for (local_40 = 0; uVar1 = local_38, local_40 < local_8; local_40 = local_40 + 1) {
    if (local_38 < 0x29) {
      local_38 = local_38 + 8;
    }
    roaring64_bitmap_add_bulk
              (in_RSI,in_stack_ffffffffffffff08,CONCAT44(uVar1,in_stack_ffffffffffffff00));
  }
  return local_10;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_of(size_t n_args, ...) {
    roaring64_bitmap_t *r = roaring64_bitmap_create();
    roaring64_bulk_context_t context = {0};
    va_list ap;
    va_start(ap, n_args);
    for (size_t i = 0; i < n_args; i++) {
        uint64_t val = va_arg(ap, uint64_t);
        roaring64_bitmap_add_bulk(r, &context, val);
    }
    va_end(ap);
    return r;
}